

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slacking.hpp
# Opt level: O2

void __thiscall slack::_detail::Slacking::trigger_error(Slacking *this,string *msg)

{
  ostream *poVar1;
  runtime_error *this_00;
  
  if (this->throw_exception_ != true) {
    poVar1 = std::operator<<((ostream *)&std::cerr,"[slacking] error. Reason: ");
    poVar1 = std::operator<<(poVar1,(string *)msg);
    std::operator<<(poVar1,'\n');
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,(string *)msg);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void trigger_error(const std::string& msg) {
        if (throw_exception_) 
            throw std::runtime_error(msg);
        else 
            std::cerr << "[slacking] error. Reason: " << msg << '\n';
    }